

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6cb367::TplModelTest_GetOverlapAreaHasOverlap_Test::TestBody
          (TplModelTest_GetOverlapAreaHasOverlap_Test *this)

{
  bool bVar1;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  int overlap_area;
  int width;
  int height;
  int col_b;
  int row_b;
  int col_a;
  int row_a;
  AssertHelper *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  Type in_stack_ffffffffffffffcc;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd0;
  
  av1_get_overlap_area(10,0x12,8,0x11,6,7);
  uVar2 = 0x19;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0._M_head_impl);
    testing::AssertionResult::failure_message((AssertionResult *)0x68ea61);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffffd0._M_head_impl,in_stack_ffffffffffffffcc,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffffa0);
    testing::Message::~Message((Message *)0x68eaad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x68eafd);
  return;
}

Assistant:

TEST(TplModelTest, GetOverlapAreaHasOverlap) {
  // The block a's area is [10, 17) x [18, 24).
  // The block b's area is [8, 15) x [17, 23).
  // The overlapping area between block a and block b is [10, 15) x [18, 23).
  // Therefore, the size of the area is (15 - 10) * (23 - 18) = 25.
  int row_a = 10;
  int col_a = 18;
  int row_b = 8;
  int col_b = 17;
  int height = 7;
  int width = 6;
  int overlap_area =
      av1_get_overlap_area(row_a, col_a, row_b, col_b, width, height);
  EXPECT_EQ(overlap_area, 25);
}